

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

value * mjs::string_replace(value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                           string *str,value *search_value,value *replace_value)

{
  gc_heap *h;
  value_type vVar1;
  bool bVar2;
  void *pvVar3;
  gc_heap_ptr_untyped *pgVar4;
  regexp_object *prVar5;
  size_type sVar6;
  long *plVar7;
  long *plVar8;
  undefined8 *puVar9;
  uint val;
  ulong uVar10;
  ulong __pos;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  wstring_view wVar14;
  value match_1;
  gc_heap_ptr<mjs::regexp_object> re;
  wstring res;
  string search_string;
  wstring_view local_b0;
  object_ptr o;
  object_ptr match;
  gc_heap_ptr_untyped local_70;
  gc_heap *local_60;
  value replace_val;
  
  pvVar3 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  h = *(gc_heap **)((long)pvVar3 + 8);
  value::value(&replace_val,replace_value);
  if (replace_val.type_ == object) {
    pgVar4 = &value::object_value(&replace_val)->super_gc_heap_ptr_untyped;
    bVar2 = gc_heap_ptr_untyped::has_type<mjs::function_object>(pgVar4);
    if (!bVar2) goto LAB_001675ed;
  }
  else {
LAB_001675ed:
    to_string((mjs *)&search_string,h,&replace_val);
    value::value(&match_1,&search_string);
    value::operator=(&replace_val,&match_1);
    value::~value(&match_1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&search_string);
  }
  if (search_value->type_ == object) {
    pgVar4 = &value::object_value(search_value)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped,pgVar4);
    bVar2 = gc_heap_ptr_untyped::has_type<mjs::regexp_object>(&o.super_gc_heap_ptr_untyped);
    if (bVar2) {
      gc_heap_ptr_untyped::gc_heap_ptr_untyped
                (&re.super_gc_heap_ptr_untyped,&o.super_gc_heap_ptr_untyped);
      pvVar3 = gc_heap_ptr_untyped::get(&re.super_gc_heap_ptr_untyped);
      if ((*(byte *)((long)pvVar3 + 0x38) & 1) == 0) {
        prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(&re.super_gc_heap_ptr_untyped);
        regexp_object::exec(&match_1,prVar5,str);
        anon_unknown_35::do_replace((anon_unknown_35 *)&search_string,str,&match_1,&replace_val);
        value::value(__return_storage_ptr__,&search_string);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&search_string);
        value::~value(&match_1);
      }
      else {
        match_1._0_16_ = string::view(str);
        std::__cxx11::wstring::
        wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
                  ((wstring *)&match,
                   (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&match_1,
                   (allocator<wchar_t> *)&search_string);
        local_60 = re.super_gc_heap_ptr_untyped.heap_;
        prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(&re.super_gc_heap_ptr_untyped);
        uVar10 = 0;
        regexp_object::last_index(prVar5,0);
        res._M_dataplus._M_p = (pointer)&res.field_2;
        res._M_string_length = 0;
        res.field_2._M_local_buf[0] = L'\0';
        do {
          prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(&re.super_gc_heap_ptr_untyped);
          regexp_object::exec(&match_1,prVar5,str);
          vVar1 = match_1.type_;
          if (match_1.type_ != null) {
            if (match_1.type_ != object) {
              __assert_fail("match.type() == value_type::object",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp_object.cpp"
                            ,0x181,
                            "string mjs::(anonymous namespace)::do_global_replace(const string &, const gc_heap_ptr<regexp_object> &, const value &)"
                           );
            }
            pgVar4 = &value::object_value(&match_1)->super_gc_heap_ptr_untyped;
            puVar9 = (undefined8 *)gc_heap_ptr_untyped::get(pgVar4);
            local_b0._M_str = L"index";
            local_b0._M_len = 5;
            (**(code **)*puVar9)((value *)&search_string,puVar9,&local_b0);
            dVar11 = value::number_value((value *)&search_string);
            value::~value((value *)&search_string);
            local_b0 = string::view(str);
            __pos = uVar10 & 0xffffffff;
            search_string.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped =
                 (gc_heap_ptr<mjs::gc_string>)
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                           (&local_b0,__pos,(ulong)(uint)((int)(long)dVar11 - (int)uVar10));
            std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      ((wstring *)&res,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&search_string);
            anon_unknown_35::do_get_replacement_string
                      ((anon_unknown_35 *)&local_b0,str,(object_ptr *)pgVar4,&replace_val);
            search_string.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped =
                 (gc_heap_ptr<mjs::gc_string>)string::view((string *)&local_b0);
            std::__cxx11::wstring::append<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      ((wstring *)&res,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&search_string);
            gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b0);
            prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(&re.super_gc_heap_ptr_untyped);
            dVar11 = regexp_object::last_index(prVar5);
            prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(&re.super_gc_heap_ptr_untyped);
            dVar12 = regexp_object::last_index(prVar5);
            uVar10 = (ulong)dVar11;
            dVar11 = (double)__pos;
            if ((dVar12 == dVar11) && (!NAN(dVar12) && !NAN(dVar11))) {
              prVar5 = (regexp_object *)gc_heap_ptr_untyped::get(&re.super_gc_heap_ptr_untyped);
              val = (int)uVar10 + 1;
              uVar10 = (ulong)val;
              regexp_object::last_index(prVar5,val);
            }
          }
          value::~value(&match_1);
        } while (vVar1 != null);
        if ((int)uVar10 == 0) {
          gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_70,(gc_heap_ptr_untyped *)str);
        }
        else {
          if ((uVar10 & 0xffffffff) < (ulong)match.super_gc_heap_ptr_untyped._8_8_) {
            std::__cxx11::wstring::substr((ulong)&match_1,(ulong)&match);
            std::__cxx11::wstring::append((wstring *)&res);
            std::__cxx11::wstring::~wstring((wstring *)&match_1);
          }
          match_1.field_1.n_ = (double)res._M_dataplus._M_p;
          match_1._0_8_ = res._M_string_length;
          string::string((string *)&local_70,local_60,(wstring_view *)&match_1);
        }
        std::__cxx11::wstring::~wstring((wstring *)&res);
        std::__cxx11::wstring::~wstring((wstring *)&match);
        value::value(__return_storage_ptr__,(string *)&local_70);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&re.super_gc_heap_ptr_untyped);
      pgVar4 = &o.super_gc_heap_ptr_untyped;
      goto LAB_00167b76;
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  }
  to_string((mjs *)&search_string,h,search_value);
  match_1._0_16_ = string::view(str);
  wVar14 = string::view(&search_string);
  sVar6 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::find
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&match_1,
                     wVar14._M_str,0,wVar14._M_len);
  if (sVar6 == 0xffffffffffffffff) {
    value::value(__return_storage_ptr__,str);
  }
  else {
    make_array((gc_heap_ptr<mjs::global_object> *)&match,(uint32_t)global);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&match.super_gc_heap_ptr_untyped);
    local_b0._M_str = L"0";
    local_b0._M_len = 1;
    string::string((string *)&res,h,&local_b0);
    value::value(&match_1,&search_string);
    (**(code **)(*plVar7 + 8))(plVar7,&res,&match_1,0);
    value::~value(&match_1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&res);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&match.super_gc_heap_ptr_untyped);
    plVar8 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar8 + 0x98))(&res,plVar8,"index");
    auVar13._8_4_ = (int)(sVar6 >> 0x20);
    auVar13._0_8_ = sVar6;
    auVar13._12_4_ = 0x45300000;
    match_1.type_ = number;
    match_1.field_1.n_ =
         (auVar13._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0);
    (**(code **)(*plVar7 + 8))(plVar7,&res,&match_1,0);
    value::~value(&match_1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&res);
    value::value(&match_1,&match);
    anon_unknown_35::do_replace((anon_unknown_35 *)&res,str,&match_1,&replace_val);
    value::value(__return_storage_ptr__,(string *)&res);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&res);
    value::~value(&match_1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&match.super_gc_heap_ptr_untyped);
  }
  pgVar4 = (gc_heap_ptr_untyped *)&search_string;
LAB_00167b76:
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(pgVar4);
  value::~value(&replace_val);
  return __return_storage_ptr__;
}

Assistant:

value string_replace(const gc_heap_ptr<global_object>& global, const string& str, const value& search_value, const value& replace_value) {
    auto& h = global->heap();

    value replace_val = replace_value;
    if (replace_val.type() != value_type::object || !replace_val.object_value().has_type<function_object>()) {
        replace_val = value{to_string(h, replace_val)};
    }

    if (search_value.type() == value_type::object) {
        auto o = search_value.object_value();
        if (o.has_type<regexp_object>()) {
            gc_heap_ptr<regexp_object> re{o};
            if ((re->flags() & regexp_flag::global) == regexp_flag::none) {
                auto match = re->exec(str);
                return value{do_replace(str, match, replace_val)};
            }
            return value{do_global_replace(str, re, replace_val)};
        }
    }

    auto search_string = to_string(h, search_value);
    auto idx = str.view().find(search_string.view());
    if (idx == std::wstring_view::npos) {
        return value{str};
    }
    // Fake up a match object
    auto match = make_array(global, 0);
    match->put(string{h, L"0"}, value{search_string});
    match->put(global->common_string("index"), value{static_cast<double>(idx)});

    return value{do_replace(str, value{match}, replace_val)};
}